

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::HasField(CrateReader *this,string *key)

{
  bool bVar1;
  int iVar2;
  value_type *this_00;
  string *psVar3;
  undefined1 local_68 [8];
  optional<tinyusdz::Token> fv;
  Field *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_> *__range2;
  string *key_local;
  CrateReader *this_local;
  
  __end2 = ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::begin
                     (&this->_fields);
  field = (Field *)::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::
                   end(&this->_fields);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_tinyusdz::crate::Field_*,_std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>_>
                                     *)&field), bVar1) {
    fv.contained._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_tinyusdz::crate::Field_*,_std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>_>
         ::operator*(&__end2);
    GetToken((optional<tinyusdz::Token> *)local_68,this,
             (Index)(((reference)fv.contained._24_8_)->token_index).super_Index.value);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_68);
    if (bVar1) {
      this_00 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                          ((optional<tinyusdz::Token> *)local_68);
      psVar3 = Token::str_abi_cxx11_(this_00);
      iVar2 = ::std::__cxx11::string::compare((string *)psVar3);
      if (iVar2 != 0) goto LAB_0022d0b8;
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
LAB_0022d0b8:
      bVar1 = false;
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional
              ((optional<tinyusdz::Token> *)local_68);
    if (bVar1) goto LAB_0022d0e7;
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::crate::Field_*,_std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 0;
LAB_0022d0e7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::HasField(const std::string &key) const {
  // Simple linear search
  for (const auto &field : _fields) {
    if (auto fv = GetToken(field.token_index)) {
      if (fv.value().str().compare(key) == 0) {
        return true;
      }
    }
  }
  return false;
}